

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInvalidBatchnorm(void)

{
  ModelDescription *pMVar1;
  FeatureDescription *pFVar2;
  Arena *pAVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *this;
  NeuralNetwork *this_00;
  NeuralNetworkLayer *this_01;
  BatchnormLayerParams *this_02;
  WeightParams *pWVar5;
  ostream *poVar6;
  undefined1 local_d8 [8];
  Result res;
  int i;
  BatchnormLayerParams *params;
  NeuralNetworkLayer *batchnormLayer;
  NeuralNetwork *nn;
  FeatureDescription *out3;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  undefined1 local_60 [4];
  int num_inputs;
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)local_60);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)local_60);
  pFVar2 = CoreML::Specification::ModelDescription::add_input(pMVar1);
  pAVar3 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar2->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar2->name_,"input",pAVar3);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  this = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(this,1);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)local_60);
  pFVar2 = CoreML::Specification::ModelDescription::add_output(pMVar1);
  pAVar3 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar2->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar2->name_,"probs",pAVar3);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  this_00 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)local_60);
  this_01 = CoreML::Specification::NeuralNetwork::add_layers(this_00);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_01,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_01,"probs");
  this_02 = CoreML::Specification::NeuralNetworkLayer::mutable_batchnorm(this_01);
  CoreML::Specification::BatchnormLayerParams::set_channels(this_02,5);
  for (res.m_message.field_2._12_4_ = 0; (int)res.m_message.field_2._12_4_ < 5;
      res.m_message.field_2._12_4_ = res.m_message.field_2._12_4_ + 1) {
    pWVar5 = CoreML::Specification::BatchnormLayerParams::mutable_beta(this_02);
    CoreML::Specification::WeightParams::add_floatvalue(pWVar5,1.0);
    pWVar5 = CoreML::Specification::BatchnormLayerParams::mutable_gamma(this_02);
    CoreML::Specification::WeightParams::add_floatvalue(pWVar5,1.0);
  }
  CoreML::validate<(MLModelType)500>((Result *)local_d8,(Model *)local_60);
  m1._oneof_case_[0]._0_1_ = CoreML::Result::good((Result *)local_d8);
  if (m1._oneof_case_[0]._0_1_) {
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xb28);
    poVar6 = std::operator<<(poVar6,": error: ");
    poVar6 = std::operator<<(poVar6,"!((res).good())");
    poVar6 = std::operator<<(poVar6," was false, expected true.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  m1._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result((Result *)local_d8);
  CoreML::Specification::Model::~Model((Model *)local_60);
  return m1._oneof_case_[0];
}

Assistant:

int testInvalidBatchnorm() {

    Specification::Model m1;

    int num_inputs = 5;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *batchnormLayer = nn->add_layers();
    batchnormLayer->add_input("input");
    batchnormLayer->add_output("probs");
    auto *params = batchnormLayer->mutable_batchnorm();
    params->set_channels(num_inputs);

    for (int i = 0; i < num_inputs; i++) {
        params->mutable_beta()->add_floatvalue(1.0);
        params->mutable_gamma()->add_floatvalue(1.0);
    }
    // Invalid because the mean and variance should be provided

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    return 0;
}